

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManFromIfGetConfig
               (Vec_Int_t *vConfigs,If_Man_t *pIfMan,If_Cut_t *pCutBest,int iLit,
               Vec_Str_t *vConfigsStr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  float fVar4;
  int *piVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  word *pwVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  
  uVar9 = pCutBest->iCutFunc;
  if ((int)uVar9 < 0) {
LAB_00210df7:
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
  }
  uVar8 = pIfMan->vTtDsds[(byte)pCutBest->field_0x1f]->pArray[uVar9 >> 1];
  if ((int)uVar8 < 0) {
LAB_00210e16:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  pwVar11 = If_DsdManGetFuncConfig(pIfMan->pIfDsdMan,uVar8 ^ uVar9 & 1);
  if (pCutBest->iCutFunc < 0) {
LAB_00210d5c:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  bVar1 = pCutBest->field_0x1f;
  uVar14 = 6;
  if (6 < bVar1) {
    uVar14 = (ulong)(uint)bVar1;
  }
  lVar15 = uVar14 * ((uint)pCutBest->iCutFunc >> 1);
  if (pIfMan->vTtPerms[bVar1]->nSize <= (int)lVar15) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
  }
  pcVar17 = pIfMan->vTtPerms[bVar1]->pArray;
  uVar8 = If_DsdManVarNum(pIfMan->pIfDsdMan);
  uVar9 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
  iVar10 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
  uVar20 = iVar10 / (int)uVar8;
  if (vConfigs->nSize < 2) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = vConfigs->pArray[1];
  iVar21 = iVar3;
  if (0 < iVar3) {
    do {
      Vec_IntPush(vConfigs,0);
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
    if (0 < iVar3) {
      iVar21 = vConfigs->nSize;
      uVar12 = iVar21 - iVar3;
      if (-1 < (int)uVar12) {
        if (iVar10 % (int)uVar8 != 0) {
          __assert_fail("nPermBitNum % nVarNum == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x608,
                        "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                       );
        }
        piVar5 = vConfigs->pArray;
        if (0 < (int)uVar9) {
          uVar14 = 0;
          do {
            if ((pwVar11[(uVar14 >> 6) + 1] >> (uVar14 & 0x3f) & 1) != 0) {
              *(ulong *)(piVar5 + (ulong)uVar12 + (uVar14 >> 6) * 2) =
                   *(ulong *)(piVar5 + (ulong)uVar12 + (uVar14 >> 6) * 2) |
                   1L << ((byte)uVar14 & 0x3f);
            }
            uVar13 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar13;
          } while (uVar9 != uVar13);
        }
        if (0 < (int)uVar8) {
          uVar14 = 0;
          uVar13 = uVar9;
          do {
            uVar18 = (uint)(*pwVar11 >> ((char)uVar14 * '\x04' & 0x3fU));
            uVar19 = *(uint *)&pCutBest->field_0x1c >> 0x18;
            if (uVar19 <= (uVar18 & 0xf)) {
              __assert_fail("Var < (int)pCutBest->nLeaves",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                            ,0x612,
                            "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                           );
            }
            cVar2 = pcVar17[(ulong)(uVar18 & 0xf) + lVar15];
            if (cVar2 < '\0') goto LAB_00210d5c;
            uVar18 = (uint)(int)cVar2 >> 1;
            if (uVar19 <= uVar18) {
              __assert_fail("Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                            ,0x615,
                            "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                           );
            }
            fVar4 = (&pCutBest[1].Area)[uVar18];
            if (((long)(int)fVar4 < 0) || (pIfMan->vObjs->nSize <= (int)fVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar18 = *(uint *)((long)pIfMan->vObjs->pArray[(int)fVar4] + 0x40);
            if ((int)uVar18 < 0) goto LAB_00210d7b;
            if (0 < (int)uVar20) {
              uVar19 = 0;
              do {
                if (((uVar18 & 1 ^ (int)cVar2) >> (uVar19 & 0x1f) & 1) != 0) {
                  *(ulong *)(piVar5 + (ulong)uVar12 + (long)((int)(uVar13 + uVar19) >> 6) * 2) =
                       *(ulong *)(piVar5 + (ulong)uVar12 + (long)((int)(uVar13 + uVar19) >> 6) * 2)
                       | 1L << ((byte)(uVar13 + uVar19) & 0x3f);
                }
                uVar19 = uVar19 + 1;
              } while (uVar20 != uVar19);
            }
            uVar14 = uVar14 + 1;
            uVar13 = uVar13 + uVar20;
          } while (uVar14 != uVar8);
        }
        uVar13 = iVar10 + uVar9;
        if (iVar3 * 0x20 <= (int)uVar13) {
          __assert_fail("nTtBitNum + nPermBitNum < 32 * nIntNum",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x61f,
                        "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int, Vec_Str_t *)"
                       );
        }
        uVar18 = pCutBest->iCutFunc;
        if ((int)uVar18 < 0) goto LAB_00210df7;
        uVar19 = pIfMan->vTtDsds[*(uint *)&pCutBest->field_0x1c >> 0x18]->pArray[uVar18 >> 1];
        if (-1 < (int)uVar19) {
          if (-1 < iLit) {
            uVar16 = *(uint *)&pCutBest->field_0x1c >> 0xc;
            pcVar17 = (char *)(ulong)uVar16;
            if (((uVar18 ^ iLit ^ uVar16 ^ uVar19) & 1) != 0) {
              pcVar17 = (char *)(1L << ((byte)uVar13 & 0x3f));
              *(ulong *)(piVar5 + (ulong)uVar12 + (long)((int)uVar13 >> 6) * 2) =
                   *(ulong *)(piVar5 + (ulong)uVar12 + (long)((int)uVar13 >> 6) * 2) |
                   (ulong)pcVar17;
            }
            if (iVar21 < 1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            *piVar5 = *piVar5 + 1;
            if (vConfigsStr != (Vec_Str_t *)0x0) {
              Vec_StrPrintF(vConfigsStr,pcVar17,(ulong)((uint)iLit >> 1));
              uVar18 = vConfigsStr->nSize;
              if (uVar18 == vConfigsStr->nCap) {
                if ((int)uVar18 < 0x10) {
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = 0x10;
                }
                else {
                  sVar7 = (ulong)uVar18 * 2;
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(sVar7);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = (int)sVar7;
                }
              }
              else {
                pcVar17 = vConfigsStr->pArray;
              }
              iVar10 = vConfigsStr->nSize;
              vConfigsStr->nSize = iVar10 + 1;
              pcVar17[iVar10] = ' ';
              if (0 < (int)uVar9) {
                uVar14 = 0;
                do {
                  uVar6 = *(ulong *)(piVar5 + (ulong)uVar12 + (uVar14 >> 6) * 2);
                  uVar18 = vConfigsStr->nSize;
                  if (uVar18 == vConfigsStr->nCap) {
                    if ((int)uVar18 < 0x10) {
                      if (vConfigsStr->pArray == (char *)0x0) {
                        pcVar17 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                      }
                      vConfigsStr->pArray = pcVar17;
                      vConfigsStr->nCap = 0x10;
                    }
                    else {
                      sVar7 = (ulong)uVar18 * 2;
                      if (vConfigsStr->pArray == (char *)0x0) {
                        pcVar17 = (char *)malloc(sVar7);
                      }
                      else {
                        pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                      }
                      vConfigsStr->pArray = pcVar17;
                      vConfigsStr->nCap = (int)sVar7;
                    }
                  }
                  else {
                    pcVar17 = vConfigsStr->pArray;
                  }
                  iVar10 = vConfigsStr->nSize;
                  vConfigsStr->nSize = iVar10 + 1;
                  pcVar17[iVar10] = (uVar6 >> (uVar14 & 0x3f) & 1) == 0 ^ 0x31;
                  uVar18 = (int)uVar14 + 1;
                  uVar14 = (ulong)uVar18;
                } while (uVar9 != uVar18);
              }
              uVar18 = vConfigsStr->nSize;
              if (uVar18 == vConfigsStr->nCap) {
                if ((int)uVar18 < 0x10) {
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = 0x10;
                }
                else {
                  sVar7 = (ulong)uVar18 * 2;
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(sVar7);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = (int)sVar7;
                }
              }
              else {
                pcVar17 = vConfigsStr->pArray;
              }
              iVar10 = vConfigsStr->nSize;
              vConfigsStr->nSize = iVar10 + 1;
              pcVar17[iVar10] = ' ';
              uVar18 = vConfigsStr->nSize;
              if (uVar18 == vConfigsStr->nCap) {
                if ((int)uVar18 < 0x10) {
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = 0x10;
                }
                else {
                  sVar7 = (ulong)uVar18 * 2;
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(sVar7);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = (int)sVar7;
                }
              }
              else {
                pcVar17 = vConfigsStr->pArray;
              }
              iVar10 = vConfigsStr->nSize;
              vConfigsStr->nSize = iVar10 + 1;
              pcVar17[iVar10] = ' ';
              if (0 < (int)uVar8) {
                uVar18 = 0;
                do {
                  if (0 < (int)uVar20) {
                    uVar19 = 0;
                    do {
                      uVar14 = *(ulong *)(piVar5 + (ulong)uVar12 +
                                                   (long)((int)(uVar9 + uVar19) >> 6) * 2);
                      uVar16 = vConfigsStr->nSize;
                      if (uVar16 == vConfigsStr->nCap) {
                        if ((int)uVar16 < 0x10) {
                          if (vConfigsStr->pArray == (char *)0x0) {
                            pcVar17 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                          }
                          vConfigsStr->pArray = pcVar17;
                          vConfigsStr->nCap = 0x10;
                        }
                        else {
                          sVar7 = (ulong)uVar16 * 2;
                          if (vConfigsStr->pArray == (char *)0x0) {
                            pcVar17 = (char *)malloc(sVar7);
                          }
                          else {
                            pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                          }
                          vConfigsStr->pArray = pcVar17;
                          vConfigsStr->nCap = (int)sVar7;
                        }
                      }
                      else {
                        pcVar17 = vConfigsStr->pArray;
                      }
                      iVar10 = vConfigsStr->nSize;
                      vConfigsStr->nSize = iVar10 + 1;
                      pcVar17[iVar10] = (uVar14 >> ((ulong)(uVar9 + uVar19) & 0x3f) & 1) == 0 ^ 0x31
                      ;
                      if (uVar19 == 0) {
                        uVar16 = vConfigsStr->nSize;
                        if (uVar16 == vConfigsStr->nCap) {
                          if ((int)uVar16 < 0x10) {
                            if (vConfigsStr->pArray == (char *)0x0) {
                              pcVar17 = (char *)malloc(0x10);
                            }
                            else {
                              pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                            }
                            vConfigsStr->pArray = pcVar17;
                            vConfigsStr->nCap = 0x10;
                          }
                          else {
                            sVar7 = (ulong)uVar16 * 2;
                            if (vConfigsStr->pArray == (char *)0x0) {
                              pcVar17 = (char *)malloc(sVar7);
                            }
                            else {
                              pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                            }
                            vConfigsStr->pArray = pcVar17;
                            vConfigsStr->nCap = (int)sVar7;
                          }
                        }
                        else {
                          pcVar17 = vConfigsStr->pArray;
                        }
                        iVar10 = vConfigsStr->nSize;
                        vConfigsStr->nSize = iVar10 + 1;
                        pcVar17[iVar10] = ' ';
                      }
                      uVar19 = uVar19 + 1;
                    } while (uVar20 != uVar19);
                  }
                  uVar19 = vConfigsStr->nSize;
                  if (uVar19 == vConfigsStr->nCap) {
                    if ((int)uVar19 < 0x10) {
                      if (vConfigsStr->pArray == (char *)0x0) {
                        pcVar17 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                      }
                      vConfigsStr->pArray = pcVar17;
                      vConfigsStr->nCap = 0x10;
                    }
                    else {
                      sVar7 = (ulong)uVar19 * 2;
                      if (vConfigsStr->pArray == (char *)0x0) {
                        pcVar17 = (char *)malloc(sVar7);
                      }
                      else {
                        pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                      }
                      vConfigsStr->pArray = pcVar17;
                      vConfigsStr->nCap = (int)sVar7;
                    }
                  }
                  else {
                    pcVar17 = vConfigsStr->pArray;
                  }
                  iVar10 = vConfigsStr->nSize;
                  vConfigsStr->nSize = iVar10 + 1;
                  pcVar17[iVar10] = ' ';
                  uVar19 = vConfigsStr->nSize;
                  if (uVar19 == vConfigsStr->nCap) {
                    if ((int)uVar19 < 0x10) {
                      if (vConfigsStr->pArray == (char *)0x0) {
                        pcVar17 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                      }
                      vConfigsStr->pArray = pcVar17;
                      vConfigsStr->nCap = 0x10;
                    }
                    else {
                      sVar7 = (ulong)uVar19 * 2;
                      if (vConfigsStr->pArray == (char *)0x0) {
                        pcVar17 = (char *)malloc(sVar7);
                      }
                      else {
                        pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                      }
                      vConfigsStr->pArray = pcVar17;
                      vConfigsStr->nCap = (int)sVar7;
                    }
                  }
                  else {
                    pcVar17 = vConfigsStr->pArray;
                  }
                  iVar10 = vConfigsStr->nSize;
                  vConfigsStr->nSize = iVar10 + 1;
                  pcVar17[iVar10] = ' ';
                  uVar18 = uVar18 + 1;
                  uVar9 = uVar9 + uVar20;
                } while (uVar18 != uVar8);
              }
              uVar14 = *(ulong *)(piVar5 + (ulong)uVar12 + (long)((int)uVar13 >> 6) * 2);
              uVar9 = vConfigsStr->nSize;
              if (uVar9 == vConfigsStr->nCap) {
                if ((int)uVar9 < 0x10) {
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = 0x10;
                }
                else {
                  sVar7 = (ulong)uVar9 * 2;
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(sVar7);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = (int)sVar7;
                }
              }
              else {
                pcVar17 = vConfigsStr->pArray;
              }
              iVar10 = vConfigsStr->nSize;
              vConfigsStr->nSize = iVar10 + 1;
              pcVar17[iVar10] = (uVar14 >> ((ulong)uVar13 & 0x3f) & 1) == 0 ^ 0x31;
              uVar9 = vConfigsStr->nSize;
              if (uVar9 == vConfigsStr->nCap) {
                if ((int)uVar9 < 0x10) {
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,0x10);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = 0x10;
                }
                else {
                  sVar7 = (ulong)uVar9 * 2;
                  if (vConfigsStr->pArray == (char *)0x0) {
                    pcVar17 = (char *)malloc(sVar7);
                  }
                  else {
                    pcVar17 = (char *)realloc(vConfigsStr->pArray,sVar7);
                  }
                  vConfigsStr->pArray = pcVar17;
                  vConfigsStr->nCap = (int)sVar7;
                }
              }
              else {
                pcVar17 = vConfigsStr->pArray;
              }
              iVar10 = vConfigsStr->nSize;
              vConfigsStr->nSize = iVar10 + 1;
              pcVar17[iVar10] = '\n';
            }
            return;
          }
LAB_00210d7b:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        goto LAB_00210e16;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManFromIfGetConfig( Vec_Int_t * vConfigs, If_Man_t * pIfMan, If_Cut_t * pCutBest, int iLit, Vec_Str_t * vConfigsStr )
{
    If_Obj_t * pIfObj = NULL;
    word * pPerm = If_DsdManGetFuncConfig( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest) ); // cell input -> DSD input
    char * pCutPerm = If_CutDsdPerm( pIfMan, pCutBest ); // DSD input -> cut input
    word * pArray;  int v, i, Lit, Var;
    int nVarNum = If_DsdManVarNum(pIfMan->pIfDsdMan);
    int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    int nPermBitOne = nPermBitNum / nVarNum;
    // prepare storage
    int nIntNum = Vec_IntEntry( vConfigs, 1 );
    for ( i = 0; i < nIntNum; i++ )
        Vec_IntPush( vConfigs, 0 );
    pArray = (word *)Vec_IntEntryP( vConfigs, Vec_IntSize(vConfigs) - nIntNum );
    assert( nPermBitNum % nVarNum == 0 );
    // set truth table bits
    for ( i = 0; i < nTtBitNum; i++ )
        if ( Abc_TtGetBit(pPerm + 1, i) )
            Abc_TtSetBit( pArray, i );
    // set permutation bits
    for ( v = 0; v < nVarNum; v++ )
    {
        // get DSD variable
        Var = ((pPerm[0] >> (v * 4)) & 0xF);
        assert( Var < (int)pCutBest->nLeaves );
        // get AIG literal
        Lit = (int)pCutPerm[Var];
        assert( Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves );
        // complement if polarity has changed
        pIfObj = If_ManObj( pIfMan, pCutBest->pLeaves[Abc_Lit2Var(Lit)] );
        Lit = Abc_LitNotCond( Lit, Abc_LitIsCompl(pIfObj->iCopy) );
        // create config literal
        for ( i = 0; i < nPermBitOne; i++ )
            if ( (Lit >> i) & 1 )
                Abc_TtSetBit( pArray, nTtBitNum + v * nPermBitOne + i );
    }
    // remember complementation
    assert( nTtBitNum + nPermBitNum < 32 * nIntNum );
    if ( Abc_LitIsCompl(If_CutDsdLit(pIfMan, pCutBest)) ^ pCutBest->fCompl ^ Abc_LitIsCompl(iLit) )
        Abc_TtSetBit( pArray, nTtBitNum + nPermBitNum );
    // update count
    Vec_IntAddToEntry( vConfigs, 0, 1 );
    // write configs
    if ( vConfigsStr )
    {
        Vec_StrPrintF( vConfigsStr, "%d", Abc_Lit2Var(iLit) );
        Vec_StrPush( vConfigsStr, ' ' );
        for ( i = 0; i < nTtBitNum; i++ )
            Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, i) ? '1' : '0') );
        Vec_StrPush( vConfigsStr, ' ' );
        Vec_StrPush( vConfigsStr, ' ' );
        for ( v = 0; v < nVarNum; v++ )
        {
            for ( i = 0; i < nPermBitOne; i++ )
            {
                Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, nTtBitNum + v * nPermBitOne + i) ? '1' : '0') );
                if ( i == 0 ) 
                    Vec_StrPush( vConfigsStr, ' ' );
            }
            Vec_StrPush( vConfigsStr, ' ' );
            Vec_StrPush( vConfigsStr, ' ' );
        }
        Vec_StrPush( vConfigsStr, (char)(Abc_TtGetBit(pArray, nTtBitNum + nPermBitNum) ? '1' : '0') );
        Vec_StrPush( vConfigsStr, '\n' );
    }
}